

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsNatural(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  Vec_Ptr_t *p;
  ulong uVar3;
  Abc_Obj_t *pAVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                  ,0x115,"Vec_Ptr_t *Abc_NtkDfsNatural(Abc_Ntk_t *)");
  }
  p = Vec_PtrAlloc(pNtk->nObjs);
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    uVar6 = pNtk->vObjs->nSize + 500;
    Vec_IntGrow(&pNtk->vTravIds,uVar6);
    uVar3 = 0;
    uVar5 = 0;
    if (0 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      (pNtk->vTravIds).pArray[uVar3] = 0;
    }
    (pNtk->vTravIds).nSize = uVar6;
  }
  iVar8 = pNtk->nTravIds;
  pNtk->nTravIds = iVar8 + 1;
  if (iVar8 < 0x3fffffff) {
    pAVar4 = Abc_AigConst1(pNtk);
    Abc_NodeSetTravIdCurrent(pAVar4);
    Vec_PtrPush(p,pAVar4);
    for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar8);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          pAVar1 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]];
          uVar6 = *(uint *)&pAVar1->field_0x14 & 0xf;
          if ((uVar6 == 5) || (uVar6 == 2)) {
            iVar2 = Abc_NodeIsTravIdCurrent(pAVar1);
            if (iVar2 == 0) {
              Abc_NodeSetTravIdCurrent(pAVar1);
              Vec_PtrPush(p,pAVar1);
            }
          }
        }
        Vec_PtrPush(p,pAVar4);
        for (lVar7 = 0; lVar7 < (pAVar4->vFanouts).nSize; lVar7 = lVar7 + 1) {
          pAVar1 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar7]];
          if (0xfffffffd < (*(uint *)&pAVar1->field_0x14 & 0xf) - 5) {
            iVar2 = Abc_NodeIsTravIdCurrent(pAVar1);
            if (iVar2 == 0) {
              Abc_NodeSetTravIdCurrent(pAVar1);
              Vec_PtrPush(p,pAVar1);
            }
          }
        }
      }
    }
    return p;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsNatural( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    // add the constant-1 nodes
    pObj = Abc_AigConst1(pNtk);
    Abc_NodeSetTravIdCurrent( pObj );
    Vec_PtrPush( vNodes, pObj );
    // add the CIs/nodes/COs in the topological order
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check the fanins and add CIs
        Abc_ObjForEachFanin( pObj, pNext, k )
            if ( Abc_ObjIsCi(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
        // add the node
        Vec_PtrPush( vNodes, pObj );
        // check the fanouts and add COs
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( Abc_ObjIsCo(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
    }
    return vNodes;
}